

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  bool bVar1;
  CppType CVar2;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  string_view sVar5;
  ScratchSpace *scratch_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"GetStringView");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringView","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringView",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringView",CPPTYPE_STRING);
  }
  sVar5 = GetStringViewImpl(this,message,field,scratch);
  return sVar5;
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);
  return GetStringViewImpl(message, field, &scratch);
}